

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O2

uint __thiscall
llvm::MCRegisterInfo::getSubRegIndex(MCRegisterInfo *this,MCRegister Reg,MCRegister SubReg)

{
  uint16_t *puVar1;
  MCRegisterDesc *pMVar2;
  ushort *puVar3;
  undefined1 local_40 [8];
  MCSubRegIterator Subs;
  
  if ((SubReg.Reg != 0) && (SubReg.Reg < this->NumRegs)) {
    puVar1 = this->SubRegIndices;
    pMVar2 = operator[](this,Reg);
    puVar3 = puVar1 + pMVar2->SubRegIndices;
    MCSubRegIterator::MCSubRegIterator((MCSubRegIterator *)local_40,Reg,this,false);
    while( true ) {
      if (Subs.super_DiffListIterator._0_8_ == 0) {
        return 0;
      }
      if ((ushort)local_40._0_2_ == SubReg.Reg) break;
      DiffListIterator::operator++((DiffListIterator *)local_40);
      puVar3 = puVar3 + 1;
    }
    return (uint)*puVar3;
  }
  __assert_fail("SubReg && SubReg < getNumRegs() && \"This is not a register\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/MCRegisterInfo.cpp"
                ,0x2e,
                "unsigned int llvm::MCRegisterInfo::getSubRegIndex(MCRegister, MCRegister) const");
}

Assistant:

unsigned MCRegisterInfo::getSubRegIndex(MCRegister Reg,
                                        MCRegister SubReg) const {
  assert(SubReg && SubReg < getNumRegs() && "This is not a register");
  // Get a pointer to the corresponding SubRegIndices list. This list has the
  // name of each sub-register in the same order as MCSubRegIterator.
  const uint16_t *SRI = SubRegIndices + get(Reg).SubRegIndices;
  for (MCSubRegIterator Subs(Reg, this); Subs.isValid(); ++Subs, ++SRI)
    if (*Subs == SubReg)
      return *SRI;
  return 0;
}